

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeline.cpp
# Opt level: O0

void __thiscall
CMU462::Timeline::drawButton(Timeline *this,int element_type,double x,double y,double size)

{
  double x2;
  uint in_ESI;
  double in_RDI;
  double in_XMM0_Qa;
  double dVar1;
  Timeline *this_00;
  Timeline *this_01;
  double r;
  Timeline *this_02;
  double x1;
  double y1;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  double x_mid_r;
  double x_mid_l;
  double y_mid;
  double x_mid;
  double y_down;
  double y_up;
  double x_right;
  double x_left;
  double border_size;
  
  dVar1 = in_XMM2_Qa / 10.0;
  this_00 = (Timeline *)((in_XMM0_Qa + in_XMM2_Qa) - dVar1);
  this_01 = (Timeline *)((in_XMM1_Qa + in_XMM2_Qa) - dVar1);
  r = (in_XMM0_Qa + dVar1 + (double)this_00) * 0.5;
  this_02 = (Timeline *)((in_XMM1_Qa + dVar1 + (double)this_01) * 0.5);
  x1 = r - dVar1 * 0.5;
  y1 = r + dVar1 * 0.5;
  x2 = (double)(ulong)in_ESI;
  switch(x2) {
  case 0.0:
    drawTriangle(this_01,r,(double)this_02,x1,y1,x2,in_RDI);
    drawTriangle(this_01,r,(double)this_02,x1,y1,x2,in_RDI);
    break;
  case 4.94065645841247e-324:
    drawRectangle(this_02,x1,y1,x2,in_RDI);
    break;
  case 9.88131291682493e-324:
    drawTriangle(this_01,r,(double)this_02,x1,y1,x2,in_RDI);
    break;
  case 1.48219693752374e-323:
    drawTriangle(this_01,r,(double)this_02,x1,y1,x2,in_RDI);
    drawRectangle(this_02,x1,y1,x2,in_RDI);
    break;
  case 1.97626258336499e-323:
    drawRectangle(this_02,x1,y1,x2,in_RDI);
    drawTriangle(this_01,r,(double)this_02,x1,y1,x2,in_RDI);
    break;
  case 2.47032822920623e-323:
    drawCircle(this_00,in_XMM1_Qa + dVar1,(double)this_01,r,(int)((ulong)this_02 >> 0x20));
  }
  return;
}

Assistant:

void Timeline::drawButton(int element_type, double x, double y, double size) {
  double border_size = size / 10.0;
  double x_left = x + border_size;
  double x_right = x + size - border_size;
  double y_up = y + border_size;
  double y_down = y + size - border_size;

  double x_mid = (x_left + x_right) / 2.0;
  double y_mid = (y_up + y_down) / 2.0;

  double x_mid_l = x_mid - border_size / 2;
  double x_mid_r = x_mid + border_size / 2;

  switch (element_type) {
    case REWIND:

      drawTriangle(x_left, y_mid, x_mid_l, y_up, x_mid_l, y_down);

      drawTriangle(x_mid_r, y_mid, x_right, y_up, x_right, y_down);

      break;

    case STOP:

      drawRectangle(x_left, y_up, x_right, y_down);

      break;

    case PLAY:

      drawTriangle(x_left, y_up, x_right, y_mid, x_left, y_down);
      break;

    case STEP_BACK:

      drawTriangle(x_left, y_mid, x_mid_l, y_up, x_mid_l, y_down);

      drawRectangle(x_mid_r, y_up, x_right, y_down);
      break;

    case STEP_FORWARD:

      drawRectangle(x_left, y_up, x_mid_l, y_down);

      drawTriangle(x_mid_r, y_up, x_right, y_mid, x_mid_r, y_down);
      break;

    case LOOP:

      drawCircle(x_mid, y_mid, size / 2 - border_size * 2, 20);

      /*
            STEP_BACK    = 3,
            STEP_FORWARD = 4,
            TIMELINE     = 5,
            LOOP         = 7,
            NONE         = 6
      */
  }
}